

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoUtils.cpp
# Opt level: O0

char * DISTRHO::getResourcePath(char *bundlePath)

{
  bool bVar1;
  int iVar2;
  char *bundlePath_local;
  
  if (bundlePath == (char *)0x0) {
    d_safe_assert("bundlePath != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoUtils.cpp"
                  ,0x5f);
    bundlePath_local = (char *)0x0;
  }
  else {
    if ((getResourcePath(char_const*)::resourcePath == '\0') &&
       (iVar2 = __cxa_guard_acquire(&getResourcePath(char_const*)::resourcePath), iVar2 != 0)) {
      String::String(&getResourcePath::resourcePath);
      __cxa_atexit(String::~String,&getResourcePath::resourcePath,&__dso_handle);
      __cxa_guard_release(&getResourcePath(char_const*)::resourcePath);
    }
    bVar1 = String::isEmpty(&getResourcePath::resourcePath);
    if (bVar1) {
      String::operator=(&getResourcePath::resourcePath,bundlePath);
      String::operator+=(&getResourcePath::resourcePath,"/resources");
    }
    bundlePath_local = String::buffer(&getResourcePath::resourcePath);
  }
  return bundlePath_local;
}

Assistant:

const char* getResourcePath(const char* const bundlePath) noexcept
{
    DISTRHO_SAFE_ASSERT_RETURN(bundlePath != nullptr, nullptr);

#if defined(DISTRHO_PLUGIN_TARGET_JACK) || defined(DISTRHO_PLUGIN_TARGET_VST2)
    static String resourcePath;

    if (resourcePath.isEmpty())
    {
        resourcePath = bundlePath;
# ifdef DISTRHO_OS_MAC
        resourcePath += "/Contents/Resources";
# else
        resourcePath += DISTRHO_OS_SEP_STR "resources";
# endif
    }

    return resourcePath.buffer();
#elif defined(DISTRHO_PLUGIN_TARGET_LV2)
    static String resourcePath;

    if (resourcePath.isEmpty())
    {
        resourcePath = bundlePath;
        resourcePath += DISTRHO_OS_SEP_STR "resources";
    }

    return resourcePath.buffer();
#elif defined(DISTRHO_PLUGIN_TARGET_VST3)
    static String resourcePath;

    if (resourcePath.isEmpty())
    {
        resourcePath = bundlePath;
        resourcePath += "/Contents/Resources";
    }

    return resourcePath.buffer();
#endif

    return nullptr;
}